

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

int __thiscall CmdLineArgsParser::Parse(CmdLineArgsParser *this,int argc,LPWSTR *argv)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = 1;
  iVar2 = -1;
  do {
    if (argc <= lVar3) {
      iVar2 = 0;
      break;
    }
    iVar1 = Parse(this,argv[lVar3]);
    lVar3 = lVar3 + 1;
  } while (iVar1 == 0);
  if ((this->flagTable->Filename).pszValue == (char16 *)0x0) {
    Js::String::Set(&this->flagTable->Filename,L"ttdSentinal.js");
  }
  return iVar2;
}

Assistant:

int
CmdLineArgsParser::Parse(int argc, __in_ecount(argc) LPWSTR argv[])
{
    int err = 0;

    for(int i = 1; i < argc; i++)
    {
        if ((err = Parse(argv[i])) != 0)
        {
            break;
        }
    }

    if(this->flagTable.Filename == nullptr)
    {
        this->flagTable.Filename = _u("ttdSentinal.js");
    }

    return err;
}